

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

Box * __thiscall amrex::MLLinOp::compactify(MLLinOp *this,Box *b)

{
  bool bVar1;
  IndexType t;
  Box *in_RDX;
  long in_RSI;
  Box *in_RDI;
  IntVect *hi;
  IntVect *lo;
  IntVect local_130;
  IntVect local_124;
  uint local_118;
  IntVect local_114;
  IntVect local_108;
  uint local_fc;
  IntVect local_f8;
  IntVect local_ec;
  IntVect *local_e0;
  IntVect *local_d8;
  Box *local_d0;
  undefined4 local_bc;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_d0 = in_RDX;
  bVar1 = LPInfo::hasHiddenDimension((LPInfo *)(in_RSI + 8));
  if (bVar1) {
    local_d8 = Box::smallEnd(local_d0);
    local_e0 = Box::bigEnd(local_d0);
    if (*(int *)(in_RSI + 0x24) == 0) {
      local_8 = local_d8;
      local_c = 1;
      local_18 = local_d8;
      local_1c = 2;
      IntVect::IntVect(&local_ec,local_d8->vect[1],local_d8->vect[2],0);
      local_28 = local_e0;
      local_2c = 1;
      local_38 = local_e0;
      local_3c = 2;
      IntVect::IntVect(&local_f8,local_e0->vect[1],local_e0->vect[2],0);
      local_fc = (uint)Box::ixType(local_d0);
      Box::Box(in_RDI,&local_ec,&local_f8,(IndexType)local_fc);
    }
    else if (*(int *)(in_RSI + 0x24) == 1) {
      local_48 = local_d8;
      local_4c = 0;
      local_58 = local_d8;
      local_5c = 2;
      IntVect::IntVect(&local_108,local_d8->vect[0],local_d8->vect[2],0);
      local_68 = local_e0;
      local_6c = 0;
      local_78 = local_e0;
      local_7c = 2;
      IntVect::IntVect(&local_114,local_e0->vect[0],local_e0->vect[2],0);
      local_118 = (uint)Box::ixType(local_d0);
      Box::Box(in_RDI,&local_108,&local_114,(IndexType)local_118);
    }
    else {
      local_88 = local_d8;
      local_8c = 0;
      local_98 = local_d8;
      local_9c = 1;
      IntVect::IntVect(&local_124,local_d8->vect[0],local_d8->vect[1],0);
      local_a8 = local_e0;
      local_ac = 0;
      local_b8 = local_e0;
      local_bc = 1;
      IntVect::IntVect(&local_130,local_e0->vect[0],local_e0->vect[1],0);
      t = Box::ixType(local_d0);
      Box::Box(in_RDI,&local_124,&local_130,t);
    }
  }
  else {
    *(undefined8 *)(in_RDI->smallend).vect = *(undefined8 *)(local_d0->smallend).vect;
    *(undefined8 *)((in_RDI->smallend).vect + 2) = *(undefined8 *)((local_d0->smallend).vect + 2);
    *(undefined8 *)((in_RDI->bigend).vect + 1) = *(undefined8 *)((local_d0->bigend).vect + 1);
    (in_RDI->btype).itype = (local_d0->btype).itype;
  }
  return in_RDI;
}

Assistant:

Box
MLLinOp::compactify (Box const& b) const noexcept
{
#if (AMREX_SPACEDIM == 3)
    if (info.hasHiddenDimension()) {
        const auto& lo = b.smallEnd();
        const auto& hi = b.bigEnd();
        if (info.hidden_direction == 0) {
            return Box(IntVect(lo[1],lo[2],0), IntVect(hi[1],hi[2],0), b.ixType());
        } else if (info.hidden_direction == 1) {
            return Box(IntVect(lo[0],lo[2],0), IntVect(hi[0],hi[2],0), b.ixType());
        } else {
            return Box(IntVect(lo[0],lo[1],0), IntVect(hi[0],hi[1],0), b.ixType());
        }
    } else
#endif
    {
        return b;
    }
}